

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<char>::NFA(NFA<char> *this,Stream *stream)

{
  CharClass<char> local_48;
  Stream *local_18;
  Stream *stream_local;
  NFA<char> *this_local;
  
  local_18 = stream;
  stream_local = (Stream *)this;
  NFABase<Centaurus::NFABaseState<char,_int>_>::NFABase
            (&this->super_NFABase<Centaurus::NFABaseState<char,_int>_>);
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFA_0028f0d0;
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states);
  CharClass<char>::CharClass(&local_48);
  add_state(this,&local_48);
  CharClass<char>::~CharClass(&local_48);
  parse(this,local_18);
  return;
}

Assistant:

NFA(Stream& stream)
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
        
        parse(stream);
    }